

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigShow.c
# Opt level: O0

void Aig_ManShow(Aig_Man_t *pMan,int fHaig,Vec_Ptr_t *vBold)

{
  char *pcVar1;
  FILE *__stream;
  FILE *pFile;
  char FileNameDot [200];
  Vec_Ptr_t *vBold_local;
  int fHaig_local;
  Aig_Man_t *pMan_local;
  
  FileNameDot._192_8_ = vBold;
  pcVar1 = Extra_FileNameGenericAppend(pMan->pName,".dot");
  sprintf((char *)&pFile,"%s",pcVar1);
  __stream = fopen((char *)&pFile,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&pFile);
  }
  else {
    fclose(__stream);
    Aig_WriteDotAig(pMan,(char *)&pFile,fHaig,(Vec_Ptr_t *)FileNameDot._192_8_);
    Abc_ShowFile((char *)&pFile);
  }
  return;
}

Assistant:

void Aig_ManShow( Aig_Man_t * pMan, int fHaig, Vec_Ptr_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    char FileNameDot[200];
    FILE * pFile;
    // create the file name
    sprintf( FileNameDot, "%s", Extra_FileNameGenericAppend(pMan->pName, ".dot") );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Aig_WriteDotAig( pMan, FileNameDot, fHaig, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}